

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,ImVec2 grid_off,float rounding,
               int rounding_corners_flags)

{
  byte bVar1;
  byte bVar2;
  ImU32 IVar3;
  ImGuiWindow *pIVar4;
  byte in_SIL;
  uint in_EDI;
  float in_XMM0_Da;
  float _y;
  float _y_00;
  float _x;
  float _x_00;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM2_Da;
  undefined8 in_XMM3_Qa;
  ImDrawCornerFlags in_XMM4_Da;
  int rounding_corners_flags_cell;
  float x2;
  float x1;
  float x;
  float y2;
  float y1;
  float y;
  int yi;
  ImU32 col_bg2;
  ImU32 col_bg1;
  ImGuiWindow *window;
  ImU32 in_stack_ffffffffffffff80;
  ImU32 in_stack_ffffffffffffff84;
  ImDrawCornerFlags rounding_corners;
  undefined8 in_stack_ffffffffffffff88;
  ImDrawList *pIVar5;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ImVec2 in_stack_ffffffffffffff98;
  ImVec2 in_stack_ffffffffffffffa0;
  float local_4c;
  float local_40;
  float local_18;
  float fStack_14;
  
  pIVar4 = GetCurrentWindow();
  if (in_EDI >> 0x18 < 0xff) {
    IVar3 = ImAlphaBlendColor(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    GetColorU32(IVar3);
    IVar3 = ImAlphaBlendColor(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    IVar3 = GetColorU32(IVar3);
    ImDrawList::AddRectFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,(ImVec2 *)in_stack_ffffffffffffff98,
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (ImU32)((ulong)in_stack_ffffffffffffff88 >> 0x20),(float)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff84);
    bVar1 = 0;
    fStack_14 = (float)((ulong)in_XMM3_Qa >> 0x20);
    for (local_40 = in_XMM0_Db + fStack_14; local_40 < in_XMM1_Db; local_40 = in_XMM2_Da + local_40)
    {
      _y = ImClamp<float>(local_40,in_XMM0_Db,in_XMM1_Db);
      _y_00 = ImMin<float>(local_40 + in_XMM2_Da,in_XMM1_Db);
      if (_y < _y_00) {
        local_18 = (float)in_XMM3_Qa;
        for (local_4c = (float)bVar1 * in_XMM2_Da + in_XMM0_Da + local_18; local_4c < in_XMM1_Da;
            local_4c = in_XMM2_Da + in_XMM2_Da + local_4c) {
          _x = ImClamp<float>(local_4c,in_XMM0_Da,in_XMM1_Da);
          _x_00 = ImMin<float>(local_4c + in_XMM2_Da,in_XMM1_Da);
          if (_x < _x_00) {
            bVar2 = 0;
            if ((_y <= in_XMM0_Db) && (bVar2 = _x <= in_XMM0_Da, in_XMM1_Da <= _x_00)) {
              bVar2 = bVar2 | 2;
            }
            if (in_XMM1_Db <= _y_00) {
              if (_x <= in_XMM0_Da) {
                bVar2 = bVar2 | 4;
              }
              if (in_XMM1_Da <= _x_00) {
                bVar2 = bVar2 | 8;
              }
            }
            pIVar5 = pIVar4->DrawList;
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,_x,_y);
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff98,_x_00,_y_00);
            rounding_corners = in_XMM4_Da;
            if ((in_SIL & bVar2) == 0) {
              rounding_corners = 0;
            }
            ImDrawList::AddRectFilled
                      ((ImDrawList *)in_stack_ffffffffffffffa0,(ImVec2 *)in_stack_ffffffffffffff98,
                       (ImVec2 *)CONCAT44(IVar3,in_stack_ffffffffffffff90),
                       (ImU32)((ulong)pIVar5 >> 0x20),SUB84(pIVar5,0),rounding_corners);
          }
        }
      }
      bVar1 = bVar1 ^ 1;
    }
  }
  else {
    ImDrawList::AddRectFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,(ImVec2 *)in_stack_ffffffffffffff98,
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (ImU32)((ulong)in_stack_ffffffffffffff88 >> 0x20),(float)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff84);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, int rounding_corners_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = GetColorU32(ImAlphaBlendColor(IM_COL32(204,204,204,255), col));
        ImU32 col_bg2 = GetColorU32(ImAlphaBlendColor(IM_COL32(128,128,128,255), col));
        window->DrawList->AddRectFilled(p_min, p_max, col_bg1, rounding, rounding_corners_flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                int rounding_corners_flags_cell = 0;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotRight; }
                rounding_corners_flags_cell &= rounding_corners_flags;
                window->DrawList->AddRectFilled(ImVec2(x1,y1), ImVec2(x2,y2), col_bg2, rounding_corners_flags_cell ? rounding : 0.0f, rounding_corners_flags_cell);
            }
        }
    }
    else
    {
        window->DrawList->AddRectFilled(p_min, p_max, col, rounding, rounding_corners_flags);
    }
}